

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state,
               hugeint_t *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference pvVar2;
  uint64_t *in_RSI;
  vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_> *in_RDI;
  hugeint_t hVar3;
  Interpolator<true> interp;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff98;
  vector<duckdb::QuantileValue,_true> *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8 [16];
  hugeint_t *in_stack_ffffffffffffffb8;
  Interpolator<true> *in_stack_ffffffffffffffc0;
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  undefined1 desc_p;
  
  bVar1 = ::std::vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>::empty
                    (in_stack_ffffffffffffffa8._8_8_);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffa0);
    FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffffa0);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    desc_p = (undefined1)((ulong)pvVar2 >> 0x38);
    ::std::vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>::size(in_RDI);
    Interpolator<true>::Interpolator
              (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_,
               (idx_t)in_stack_ffffffffffffffa0,(bool)desc_p);
    ::std::vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>::data
              ((vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_> *)0x1d19b65);
    hVar3 = Interpolator<true>::
            Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
    *in_RSI = hVar3.lower;
    in_RSI[1] = hVar3.upper;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}